

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_multiCallsMadeMoreThanExpectedTimesIsNotFulfilledAndCannotMatchActualCalls_Test
::testBody(TEST_MockExpectedCall_multiCallsMadeMoreThanExpectedTimesIsNotFulfilledAndCannotMatchActualCalls_Test
           *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString local_c0;
  undefined1 local_b0 [8];
  MockCheckedExpectedCall expectedCall;
  TEST_MockExpectedCall_multiCallsMadeMoreThanExpectedTimesIsNotFulfilledAndCannotMatchActualCalls_Test
  *this_local;
  
  expectedCall._152_8_ = this;
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0,3);
  SimpleString::SimpleString(&local_c0,"name");
  MockCheckedExpectedCall::withName((MockCheckedExpectedCall *)local_b0,&local_c0);
  SimpleString::~SimpleString(&local_c0);
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_b0,1);
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_b0,2);
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_b0,3);
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_b0,4);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = MockCheckedExpectedCall::isFulfilled((MockCheckedExpectedCall *)local_b0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!expectedCall.isFulfilled()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x1fd,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = MockCheckedExpectedCall::canMatchActualCalls((MockCheckedExpectedCall *)local_b0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!expectedCall.canMatchActualCalls()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x1fe,pTVar3);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0);
  return;
}

Assistant:

TEST(MockExpectedCall, multiCallsMadeMoreThanExpectedTimesIsNotFulfilledAndCannotMatchActualCalls)
{
    MockCheckedExpectedCall expectedCall(3);
    expectedCall.withName("name");
    expectedCall.callWasMade(1);
    expectedCall.callWasMade(2);
    expectedCall.callWasMade(3);
    expectedCall.callWasMade(4);
    CHECK(!expectedCall.isFulfilled());
    CHECK(!expectedCall.canMatchActualCalls());
}